

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_socket.cpp
# Opt level: O0

void __thiscall cppnet::ConnectSocket::Accept(ConnectSocket *this)

{
  bool bVar1;
  Event *pEVar2;
  unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
  *this_00;
  mapped_type *this_01;
  element_type *peVar3;
  undefined1 local_60 [8];
  shared_ptr<cppnet::EventActions> actions;
  enable_shared_from_this<cppnet::ConnectSocket> local_40;
  shared_ptr<cppnet::Socket> local_30 [2];
  ConnectSocket *local_10;
  ConnectSocket *this_local;
  
  local_10 = this;
  if (this->_accept_event == (Event *)0x0) {
    pEVar2 = (Event *)operator_new(0x28);
    Event::Event(pEVar2);
    this->_accept_event = pEVar2;
    pEVar2 = this->_accept_event;
    std::enable_shared_from_this<cppnet::ConnectSocket>::shared_from_this(&local_40);
    std::shared_ptr<cppnet::Socket>::shared_ptr<cppnet::ConnectSocket,void>
              (local_30,(shared_ptr<cppnet::ConnectSocket> *)&local_40);
    Event::SetSocket(pEVar2,local_30);
    std::shared_ptr<cppnet::Socket>::~shared_ptr(local_30);
    std::shared_ptr<cppnet::ConnectSocket>::~shared_ptr
              ((shared_ptr<cppnet::ConnectSocket> *)&local_40);
  }
  std::enable_shared_from_this<cppnet::ConnectSocket>::shared_from_this
            ((enable_shared_from_this<cppnet::ConnectSocket> *)
             &actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  this_00 = (unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
             *)Socket::__all_socket_map();
  this_01 = std::
            unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
            ::operator[](this_00,&(this->super_Socket)._sock);
  std::shared_ptr<cppnet::Socket>::operator=
            (this_01,(shared_ptr<cppnet::ConnectSocket> *)
                     &actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  std::shared_ptr<cppnet::ConnectSocket>::~shared_ptr
            ((shared_ptr<cppnet::ConnectSocket> *)
             &actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Socket::GetEventActions((Socket *)local_60);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_60);
    (*peVar3->_vptr_EventActions[6])(peVar3,this->_accept_event);
  }
  std::shared_ptr<cppnet::EventActions>::~shared_ptr((shared_ptr<cppnet::EventActions> *)local_60);
  return;
}

Assistant:

void ConnectSocket::Accept() {
    if (!_accept_event) {
        _accept_event = new Event();
        _accept_event->SetSocket(shared_from_this());
    }
    __all_socket_map[_sock] = shared_from_this();
    auto actions = GetEventActions();
    if (actions) {
        actions->AddAcceptEvent(_accept_event);
    }
}